

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O2

void __thiscall capnp::TextCodec::decode(TextCodec *this,StringPtr input,Builder output)

{
  Builder result;
  Builder builder;
  Reader assignments;
  undefined8 uVar1;
  BuilderArena *pBVar2;
  size_t sVar3;
  char *pcVar4;
  StringPtr message;
  Orphanage orphanageParam;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar5;
  ArrayPtr<const_char> input_00;
  Fault f_2;
  ThrowingErrorReporter errorReporter_1;
  ParserInput parserInput;
  ThrowingErrorReporter errorReporter;
  ExternalResolver nullResolver;
  ValueTranslator translator;
  Fault f;
  uint uStack_3c0;
  undefined4 uStack_3bc;
  byte *local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  Reader local_398;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> _expression95;
  Builder lexedTokens;
  Reader local_310;
  Reader tokens;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  
  sVar3 = input.content.size_;
  pcVar4 = input.content.ptr;
  errorReporter.super_ErrorReporter._vptr_ErrorReporter = (_func_int **)&PTR_addError_00274360;
  errorReporter.input.content.ptr = pcVar4;
  errorReporter.input.content.size_ = sVar3;
  MallocMessageBuilder::MallocMessageBuilder(&tokenArena,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedTokens>
            (&lexedTokens,&tokenArena.super_MessageBuilder);
  result._builder.capTable = lexedTokens._builder.capTable;
  result._builder.segment = lexedTokens._builder.segment;
  result._builder.data = lexedTokens._builder.data;
  result._builder.pointers = lexedTokens._builder.pointers;
  result._builder.dataSize = lexedTokens._builder.dataSize;
  result._builder.pointerCount = lexedTokens._builder.pointerCount;
  result._builder._38_2_ = lexedTokens._builder._38_2_;
  input_00.size_ = sVar3 - 1;
  input_00.ptr = pcVar4;
  capnp::compiler::lex(input_00,result,&errorReporter.super_ErrorReporter);
  orphanageParam = MessageBuilder::getOrphanage(&tokenArena.super_MessageBuilder);
  capnp::compiler::CapnpParser::CapnpParser
            (&parser,orphanageParam,&errorReporter.super_ErrorReporter);
  capnp::_::StructBuilder::asReader(&lexedTokens._builder);
  capnp::compiler::LexedTokens::Reader::getTokens(&tokens,(Reader *)&parserInput);
  parserInput.parent =
       (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
        *)0x0;
  parserInput.pos.index = 0;
  parserInput.end.index = tokens.reader.elementCount;
  parserInput.best.index = 0;
  parserInput.pos.container = &tokens;
  parserInput.end.container = &tokens;
  parserInput.best.container = &tokens;
  if (tokens.reader.elementCount == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&f_2,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x6d,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal(&f_2);
  }
  (*(code *)**(undefined8 **)parser.parsers.expression.wrapper)
            (&f_2,parser.parsers.expression.wrapper,parser.parsers.expression.parser);
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::NullableValue
            (&_expression95,(NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)&f_2);
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue
            ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)&f_2);
  if (_expression95.isSet == true) {
    f_2.exception = (Exception *)parserInput.pos.container;
    if (parserInput.pos.index != tokens.reader.elementCount) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>&,char_const(&)[23]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x61,FAILED,"parserInput.getPosition() == tokens.end()",
                 "_kjCondition,\"Extra tokens in input.\"",
                 (DebugComparison<capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                  *)&f_2,(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal(&f);
    }
    capnp::_::OrphanGetImpl<capnp::compiler::Expression,_(capnp::Kind)3>::applyReader
              (&local_310,&_expression95.field_1.value.builder);
    local_398._reader.dataSize = local_310._reader.dataSize;
    local_398._reader.pointerCount = local_310._reader.pointerCount;
    local_398._reader._38_2_ = local_310._reader._38_2_;
    uVar1 = local_398._reader._32_8_;
    local_398._reader.nestingLimit = local_310._reader.nestingLimit;
    local_398._reader._44_4_ = local_310._reader._44_4_;
    local_398._reader.segment = local_310._reader.segment;
    local_398._reader.capTable = local_310._reader.capTable;
    local_398._reader.data = local_310._reader.data;
    local_398._reader.pointers = local_310._reader.pointers;
    local_398._reader.dataSize = local_310._reader.dataSize;
    local_398._reader._32_8_ = uVar1;
    if (local_398._reader.dataSize < 0x10) {
      errorReporter_1.super_ErrorReporter._vptr_ErrorReporter =
           (_func_int **)((ulong)errorReporter_1.super_ErrorReporter._vptr_ErrorReporter._1_7_ << 8)
      ;
    }
    else {
      errorReporter_1.super_ErrorReporter._vptr_ErrorReporter._0_1_ = *local_310._reader.data == 7;
      if (*local_310._reader.data == 7) {
        errorReporter_1.super_ErrorReporter._vptr_ErrorReporter =
             (_func_int **)&PTR_addError_00274360;
        nullResolver.super_Resolver._vptr_Resolver = (Resolver)&PTR_resolveConstant_002743a0;
        translator.orphanage.arena = (BuilderArena *)output.builder.data;
        translator.orphanage.capTable = (CapTableBuilder *)output.builder.pointers;
        translator.resolver = (Resolver *)output.builder.segment;
        translator.errorReporter = (ErrorReporter *)output.builder.capTable;
        errorReporter_1.input.content.ptr = pcVar4;
        errorReporter_1.input.content.size_ = sVar3;
        pBVar2 = capnp::_::StructBuilder::getArena((StructBuilder *)&translator);
        translator.orphanage.capTable =
             capnp::_::StructBuilder::getCapTable((StructBuilder *)&translator);
        translator.resolver = &nullResolver.super_Resolver;
        translator.errorReporter = &errorReporter_1.super_ErrorReporter;
        f_2.exception = (Exception *)output.schema.super_Schema.raw;
        translator.orphanage.arena = pBVar2;
        capnp::compiler::Expression::Reader::getTuple((Reader *)&f,&local_398);
        assignments.reader.capTable._4_4_ = uStack_3bc;
        assignments.reader.capTable._0_4_ = uStack_3c0;
        builder.builder.segment = output.builder.segment;
        builder.schema.super_Schema.raw = (Schema)(Schema)f_2.exception;
        builder.builder.capTable = output.builder.capTable;
        builder.builder.data = output.builder.data;
        builder.builder.pointers = output.builder.pointers;
        builder.builder.dataSize = output.builder.dataSize;
        builder.builder.pointerCount = output.builder.pointerCount;
        builder.builder._38_2_ = output.builder._38_2_;
        assignments.reader.segment = (SegmentReader *)f.exception;
        assignments.reader.ptr = local_3b8;
        assignments.reader._24_8_ = uStack_3b0;
        assignments.reader._32_8_ = local_3a8;
        assignments.reader._40_8_ = uStack_3a0;
        capnp::compiler::ValueTranslator::fillStructValue(&translator,builder,assignments);
        goto LAB_0014d91a;
      }
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[33]>
              ((Fault *)&translator,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x88,FAILED,"expression.isTuple()",
               "_kjCondition,\"Input does not contain a struct.\"",
               (DebugExpression<bool> *)&errorReporter_1,
               (char (*) [33])"Input does not contain a struct.");
    kj::_::Debug::Fault::~Fault((Fault *)&translator);
  }
  else {
    IVar5 = kj::parse::
            IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
            ::getBest(&parserInput);
    f.exception = (Exception *)IVar5.container;
    if (IVar5.index == tokens.reader.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x67,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal(&f_2);
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
    ::operator*((Reader *)&f_2,
                (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                 *)&f);
    message.content.size_ = 0xc;
    message.content.ptr = "Parse error";
    capnp::compiler::ErrorReporter::addErrorOn<capnp::compiler::Token::Reader>
              (&errorReporter.super_ErrorReporter,(Reader *)&f_2,message);
  }
LAB_0014d91a:
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue(&_expression95);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::~IteratorInput(&parserInput);
  capnp::compiler::CapnpParser::~CapnpParser(&parser);
  MallocMessageBuilder::~MallocMessageBuilder(&tokenArena);
  return;
}

Assistant:

void TextCodec::decode(kj::StringPtr input, DynamicStruct::Builder output) const {
  lexAndParseExpression(input, [&](compiler::Expression::Reader expression) {
    KJ_REQUIRE(expression.isTuple(), "Input does not contain a struct.") { return; }

    ThrowingErrorReporter errorReporter(input);
    ExternalResolver nullResolver;

    Orphanage orphanage = Orphanage::getForMessageContaining(output);
    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    translator.fillStructValue(output, expression.getTuple());
  });
}